

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cc
# Opt level: O0

void __thiscall re2c::Input::~Input(Input *this)

{
  Input *this_local;
  
  if ((this->file != (FILE *)0x0) && (this->file != _stdin)) {
    fclose((FILE *)this->file);
  }
  std::__cxx11::string::~string((string *)&this->file_name);
  return;
}

Assistant:

Input::~Input ()
{
	if (file != NULL && file != stdin)
	{
		fclose (file);
	}
}